

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BlendFuncSeparateTestCase::SetBlendFunc
          (BlendFuncSeparateTestCase *this,GLenum func)

{
  GLenum dfactorRGB;
  GLenum sfactorRGB;
  
  switch((this->super_BlendFuncTestCase).m_testTargetName) {
  case 0x80c8:
    sfactorRGB = 0;
    dfactorRGB = func;
    break;
  case 0x80c9:
    dfactorRGB = 0;
    sfactorRGB = func;
    break;
  case 0x80ca:
    glu::CallLogWrapper::glBlendFuncSeparate
              (&(this->super_BlendFuncTestCase).super_ApiCase.super_CallLogWrapper,0,0,0,func);
    return;
  case 0x80cb:
    sfactorRGB = 0;
    dfactorRGB = 0;
    goto LAB_003a4315;
  default:
    return;
  }
  func = 0;
LAB_003a4315:
  glu::CallLogWrapper::glBlendFuncSeparate
            (&(this->super_BlendFuncTestCase).super_ApiCase.super_CallLogWrapper,sfactorRGB,
             dfactorRGB,func,0);
  return;
}

Assistant:

void SetBlendFunc (GLenum func)
	{
		switch (m_testTargetName)
		{
		case GL_BLEND_SRC_RGB:
			glBlendFuncSeparate(func, GL_ZERO, GL_ZERO, GL_ZERO);
			break;

		case GL_BLEND_DST_RGB:
			glBlendFuncSeparate(GL_ZERO, func, GL_ZERO, GL_ZERO);
			break;

		case GL_BLEND_SRC_ALPHA:
			glBlendFuncSeparate(GL_ZERO, GL_ZERO, func, GL_ZERO);
			break;

		case GL_BLEND_DST_ALPHA:
			glBlendFuncSeparate(GL_ZERO, GL_ZERO, GL_ZERO, func);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}